

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
DictionaryInstance::op_removeKey
          (DictionaryInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  size_type sVar1;
  undefined8 *puVar2;
  map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  string *in_stack_00000020;
  string *in_stack_00000028;
  shared_ptr<Instance> key;
  key_type *in_stack_ffffffffffffff98;
  allocator *paVar3;
  allocator local_35 [29];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar1 != 1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  this_00 = (map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
             *)(in_RSI + 0x58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  get_shared_instance(in_stack_00000028,in_stack_00000020);
  std::
  map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
  ::erase(this_00,in_stack_ffffffffffffff98);
  paVar3 = local_35;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"null",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c4465);
  return in_RDI;
}

Assistant:

std::string DictionaryInstance::op_removeKey(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> key = get_shared_instance(_key_type, arguments[0]);
    _value.erase(key);
    return "null";
}